

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall
CLI::ExcludesError::ExcludesError(ExcludesError *this,string *curname,string *subname)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ::std::operator+(&local_38,curname," excludes ");
  ::std::operator+(&bStack_58,&local_38,subname);
  ExcludesError(this,&bStack_58,ExcludesError);
  ::std::__cxx11::string::~string((string *)&bStack_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

ExcludesError(std::string curname, std::string subname)
        : ExcludesError(curname + " excludes " + subname, ExitCodes::ExcludesError) {}